

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joiner_session.cpp
# Opt level: O0

int __thiscall
ot::commissioner::JoinerSession::RelaySocket::Send(RelaySocket *this,uint8_t *aBuf,size_t aLen)

{
  JoinerSession *this_00;
  MessageSubType MVar1;
  bool bVar2;
  uchar *__last;
  Error *aError;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar3;
  string_view fmt;
  format_args args;
  int local_248;
  ErrorCode local_1fc;
  string local_1f8;
  JoinerSession *local_1d8;
  anon_class_1_0_00000001 local_1ca;
  v10 local_1c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1c8;
  char *local_1c0;
  string local_1b8;
  allocator local_191;
  string local_190;
  ErrorCode local_16c [2];
  allocator<unsigned_char> local_161;
  ByteArray local_160;
  Error local_148;
  byte local_109;
  undefined1 local_108 [7];
  bool includeKek;
  Error error;
  size_t aLen_local;
  uint8_t *aBuf_local;
  RelaySocket *this_local;
  undefined1 local_a8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  char *local_90;
  string *local_88;
  v10 *local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  char *pcStack_70;
  string *local_68;
  v10 *local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  char *pcStack_40;
  RelaySocket **local_38;
  undefined1 *local_30;
  RelaySocket **local_28;
  undefined8 local_20;
  undefined1 *local_18;
  RelaySocket **local_10;
  
  error.mMessage.field_2._8_8_ = aLen;
  Error::Error((Error *)local_108);
  MVar1 = Socket::GetSubType(&this->super_Socket);
  local_109 = MVar1 == kJoinFinResponse;
  this_00 = this->mJoinerSession;
  __last = aBuf + error.mMessage.field_2._8_8_;
  std::allocator<unsigned_char>::allocator(&local_161);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_160,aBuf,__last,
             &local_161);
  SendRlyTx(&local_148,this_00,&local_160,(bool)(local_109 & 1));
  aError = Error::operator=((Error *)local_108,&local_148);
  local_16c[1] = 0;
  commissioner::operator!=(aError,local_16c + 1);
  Error::~Error(&local_148);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_160);
  std::allocator<unsigned_char>::~allocator(&local_161);
  local_16c[0] = kNone;
  bVar2 = commissioner::operator!=((Error *)local_108,local_16c);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_190,"joiner-session",&local_191);
    Send::anon_class_1_0_00000001::operator()(&local_1ca);
    local_58 = &local_1c8;
    local_60 = &local_1c9;
    bVar3 = ::fmt::v10::operator()(local_60);
    local_1c0 = (char *)bVar3.size_;
    local_1c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bVar3.data_;
    ::fmt::v10::detail::
    check_format_string<void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FMT_COMPILE_STRING,_0>
              ();
    local_1d8 = this->mJoinerSession;
    Error::ToString_abi_cxx11_(&local_1f8,(Error *)local_108);
    local_68 = &local_1b8;
    local_78 = local_1c8;
    pcStack_70 = local_1c0;
    local_80 = (v10 *)&local_1d8;
    local_88 = &local_1f8;
    local_50 = &local_78;
    local_98 = local_1c8;
    local_90 = local_1c0;
    local_48 = local_98;
    pcStack_40 = local_90;
    ::fmt::v10::
    make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,void*,std::__cxx11::string>
              ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&this_local,local_80,(void **)local_88,local_1c8);
    local_30 = local_a8;
    local_38 = &this_local;
    local_20 = 0xde;
    fmt.size_ = 0xde;
    fmt.data_ = local_90;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_38;
    local_28 = local_38;
    local_18 = local_30;
    local_10 = local_38;
    ::fmt::v10::vformat_abi_cxx11_(&local_1b8,(v10 *)local_98,fmt,args);
    Log(kError,&local_190,&local_1b8);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_190);
    std::allocator<char>::~allocator((allocator<char> *)&local_191);
  }
  local_1fc = kNone;
  bVar2 = commissioner::operator==((Error *)local_108,&local_1fc);
  if (bVar2) {
    local_248 = (int)error.mMessage.field_2._8_8_;
  }
  else {
    local_248 = -0x4e;
  }
  Error::~Error((Error *)local_108);
  return local_248;
}

Assistant:

int JoinerSession::RelaySocket::Send(const uint8_t *aBuf, size_t aLen)
{
    Error error;
    bool  includeKek = GetSubType() == MessageSubType::kJoinFinResponse;

    SuccessOrExit(error = mJoinerSession.SendRlyTx({aBuf, aBuf + aLen}, includeKek));

exit:
    if (error != ErrorCode::kNone)
    {
        LOG_ERROR(LOG_REGION_JOINER_SESSION, "session(={}) send RLY_TX.ntf failed: {}",
                  static_cast<void *>(&mJoinerSession), error.ToString());
    }
    return error == ErrorCode::kNone ? static_cast<int>(aLen) : MBEDTLS_ERR_NET_SEND_FAILED;
}